

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_generic_fwclose(mcpl_generic_wfilehandle_t *fh)

{
  long *in_RDI;
  
  if (*in_RDI == 0) {
    mcpl_error((char *)0x10912b);
  }
  fclose((FILE *)*in_RDI);
  *(undefined4 *)(in_RDI + 2) = 0;
  in_RDI[1] = 0;
  *in_RDI = 0;
  return;
}

Assistant:

void mcpl_generic_fwclose( mcpl_generic_wfilehandle_t* fh )
{
  if ( !fh->internal )
    mcpl_error("Error trying to close invalid file handle");
  fclose( (FILE*)(fh->internal) );
  fh->mode = 0;
  fh->current_pos = 0;
  fh->internal = NULL;
}